

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

void __thiscall sector_t::ClosestPoint(sector_t *this,DVector2 *in,DVector2 *out)

{
  double dVar1;
  double dVar2;
  vertex_t *pvVar3;
  vertex_t *pvVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if ((long)this->linecount < 1) {
    dVar7 = 0.0;
    dVar11 = 0.0;
  }
  else {
    dVar6 = INFINITY;
    lVar5 = 0;
    dVar7 = 0.0;
    dVar8 = 0.0;
    do {
      pvVar3 = this->lines[lVar5]->v1;
      pvVar4 = this->lines[lVar5]->v2;
      dVar10 = (pvVar4->p).X;
      dVar12 = (pvVar4->p).Y;
      dVar1 = (pvVar3->p).X;
      dVar2 = (pvVar3->p).Y;
      dVar14 = dVar10 - dVar1;
      dVar13 = dVar12 - dVar2;
      dVar15 = dVar13 * dVar13 + dVar14 * dVar14;
      dVar11 = dVar1;
      dVar9 = dVar2;
      if ((((dVar15 != 0.0) || (NAN(dVar15))) &&
          (dVar15 = ((in->Y - dVar2) * dVar13 + (in->X - dVar1) * dVar14) / dVar15, 0.0 < dVar15))
         && (dVar11 = dVar10, dVar9 = dVar12, dVar15 < 1.0)) {
        dVar11 = dVar1 + dVar14 * dVar15;
        dVar9 = dVar2 + dVar13 * dVar15;
      }
      dVar12 = dVar11 - in->X;
      dVar10 = dVar9 - in->Y;
      dVar10 = dVar10 * dVar10 + dVar12 * dVar12;
      if (dVar6 <= dVar10) {
        dVar11 = dVar8;
      }
      dVar7 = (double)(~-(ulong)(dVar10 < dVar6) & (ulong)dVar7 |
                      (ulong)dVar9 & -(ulong)(dVar10 < dVar6));
      if (dVar6 <= dVar10) {
        dVar10 = dVar6;
      }
      dVar6 = dVar10;
      lVar5 = lVar5 + 1;
      dVar8 = dVar11;
    } while (this->linecount != lVar5);
  }
  out->Y = dVar7;
  out->X = dVar11;
  return;
}

Assistant:

void sector_t::ClosestPoint(const DVector2 &in, DVector2 &out) const
{
	int i;
	double x = in.X, y = in.Y;
	double bestdist = HUGE_VAL;
	double bestx = 0, besty = 0;

	for (i = 0; i < linecount; ++i)
	{
		vertex_t *v1 = lines[i]->v1;
		vertex_t *v2 = lines[i]->v2;
		double a = v2->fX() - v1->fX();
		double b = v2->fY() - v1->fY();
		double den = a*a + b*b;
		double ix, iy, dist;

		if (den == 0)
		{ // Line is actually a point!
			ix = v1->fX();
			iy = v1->fY();
		}
		else
		{
			double num = (x - v1->fX()) * a + (y - v1->fY()) * b;
			double u = num / den;
			if (u <= 0)
			{
				ix = v1->fX();
				iy = v1->fY();
			}
			else if (u >= 1)
			{
				ix = v2->fX();
				iy = v2->fY();
			}
			else
			{
				ix = v1->fX() + u * a;
				iy = v1->fY() + u * b;
			}
		}
		a = (ix - x);
		b = (iy - y);
		dist = a*a + b*b;
		if (dist < bestdist)
		{
			bestdist = dist;
			bestx = ix;
			besty = iy;
		}
	}
	out = { bestx, besty };
}